

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>_>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>_>
                   *this)

{
  undefined1 *__ptr;
  undefined1 *puVar1;
  
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
          ).
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
          .super_SmallVectorBase.BeginX;
  puVar1 = (undefined1 *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
           .super_SmallVectorBase.EndX;
  if (puVar1 != __ptr) {
    do {
      if (puVar1 + -0xf0 != *(undefined1 **)(puVar1 + -0x108)) {
        free(*(undefined1 **)(puVar1 + -0x108));
      }
      puVar1 = puVar1 + -0x138;
    } while (puVar1 != __ptr);
    __ptr = (undefined1 *)
            (this->
            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
            .super_SmallVectorBase.BeginX;
  }
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<78U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>,_void>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }